

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

LTChannel * LTFlightDataGetCh(dataRefsLT ch)

{
  listPtrLTChannelTy *plVar1;
  
  plVar1 = &listFDC_abi_cxx11_;
  do {
    plVar1 = (listPtrLTChannelTy *)
             (plVar1->
             super__List_base<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>,_std::allocator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (plVar1 == &listFDC_abi_cxx11_) {
      return (LTChannel *)0x0;
    }
  } while ((*(LTChannel **)((long)plVar1 + 0x10))->channel != ch);
  return *(LTChannel **)((long)plVar1 + 0x10);
}

Assistant:

LTChannel* LTFlightDataGetCh (dataRefsLT ch)
{
    listPtrLTChannelTy::iterator iter =
    std::find_if(listFDC.begin(), listFDC.end(),
                 [ch](const ptrLTChannelTy& pCh)
                 { return pCh->channel == ch; });
    if (iter == listFDC.end())
        return nullptr;
    else
        return iter->get();
}